

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_tests.cpp
# Opt level: O3

void __thiscall
wallet::init_tests::walletinit_verify_walletdir_default::test_method
          (walletinit_verify_walletdir_default *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string arg;
  int iVar2;
  mapped_type *walletdir_path;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar5;
  _func_int **in_stack_fffffffffffffe48;
  bool in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe51;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  path *local_148;
  undefined **local_140;
  undefined1 local_138;
  undefined1 *local_130;
  path **local_128;
  path *local_120;
  char *local_118;
  char *local_110;
  assertion_result local_108;
  path local_f0;
  path expected_path;
  undefined1 local_a0 [32];
  path walletdir;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &walletdir.super_path._M_pathname.field_2;
  walletdir.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&walletdir,"default","");
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_walletdir_path_cases;
  walletdir_path =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
       ::operator[](this_00,(key_type *)&walletdir);
  InitWalletDirTestingSetup::SetWalletDir(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,walletdir_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)walletdir.super_path._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(walletdir.super_path._M_pathname._M_dataplus._M_p,
                    walletdir.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  iVar2 = (*(((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_wallet_loader._M_t.
              super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
              ._M_t.
              super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
              .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl)->
            super_ChainClient)._vptr_ChainClient[3])();
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar5 = 0x7bdede;
  file.m_end = (iterator)0x14;
  file.m_begin = (iterator)&local_158;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_168,msg);
  expected_path.super_path._M_pathname._M_dataplus._M_p._0_1_ = (char)iVar2;
  expected_path.super_path._M_pathname._M_string_length = 0;
  expected_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  walletdir.super_path._M_pathname.field_2._8_8_ = local_58;
  local_58._0_8_ = "result == true";
  local_58._8_8_ = "";
  walletdir.super_path._M_pathname._M_string_length._0_1_ = 0;
  walletdir.super_path._M_pathname._M_dataplus._M_p = "B";
  walletdir.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_170 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&expected_path,(lazy_ostream *)&walletdir,1,0,WARN,_cVar5,
             (size_t)&local_178,0x14);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&expected_path.super_path._M_pathname.field_2._M_allocated_capacity);
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"-walletdir","");
  expected_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  expected_path.super_path._M_pathname.field_2._8_8_ = 0;
  expected_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  expected_path.super_path._M_pathname._M_string_length = 0;
  expected_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&expected_path.super_path);
  arg._M_string_length._0_1_ = in_stack_fffffffffffffe50;
  arg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe48;
  arg._M_string_length._1_7_ = in_stack_fffffffffffffe51;
  arg.field_2._M_allocated_capacity = in_stack_fffffffffffffe58;
  arg.field_2._8_8_ = in_stack_fffffffffffffe60;
  ArgsManager::GetPathArg
            (&walletdir,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_args,
             arg,(path *)local_a0);
  std::filesystem::__cxx11::path::~path(&expected_path.super_path);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"default","");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::operator[](this_00,(key_type *)local_58);
  std::filesystem::canonical(&local_f0);
  std::filesystem::__cxx11::path::path(&expected_path.super_path,(path *)&local_f0);
  std::filesystem::__cxx11::path::~path((path *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x17;
  file_00.m_begin = (iterator)&local_188;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_198,
             msg_00);
  iVar2 = std::filesystem::__cxx11::path::compare((path *)&walletdir);
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_110 = "";
  local_48._8_8_ = &local_120;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae698;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae698;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_148 = &expected_path;
  local_120 = (path *)&walletdir;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)&stack0xfffffffffffffe48,1,2,REQUIRE,0xf81358,
             (size_t)&local_118,0x17,local_58,"expected_path",&local_140);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  std::filesystem::__cxx11::path::~path(&expected_path.super_path);
  std::filesystem::__cxx11::path::~path(&walletdir.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletinit_verify_walletdir_default)
{
    SetWalletDir(m_walletdir_path_cases["default"]);
    bool result = m_wallet_loader->verify();
    BOOST_CHECK(result == true);
    fs::path walletdir = m_args.GetPathArg("-walletdir");
    fs::path expected_path = fs::canonical(m_walletdir_path_cases["default"]);
    BOOST_CHECK_EQUAL(walletdir, expected_path);
}